

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa.cc
# Opt level: O0

int MLDSA65_sign(uint8_t *out_encoded_signature,MLDSA65_private_key *private_key,uint8_t *msg,
                size_t msg_len,uint8_t *context,size_t context_len)

{
  bcm_status status;
  size_t context_len_local;
  uint8_t *context_local;
  size_t msg_len_local;
  uint8_t *msg_local;
  MLDSA65_private_key *private_key_local;
  uint8_t *out_encoded_signature_local;
  
  if (context_len < 0x100) {
    status = BCM_mldsa65_sign(out_encoded_signature,(BCM_mldsa65_private_key *)private_key,msg,
                              msg_len,context,context_len);
    out_encoded_signature_local._4_4_ = bcm_success(status);
  }
  else {
    out_encoded_signature_local._4_4_ = 0;
  }
  return out_encoded_signature_local._4_4_;
}

Assistant:

int MLDSA65_sign(uint8_t out_encoded_signature[MLDSA65_SIGNATURE_BYTES],
                 const struct MLDSA65_private_key *private_key,
                 const uint8_t *msg, size_t msg_len, const uint8_t *context,
                 size_t context_len) {
  if (context_len > 255) {
    return 0;
  }
  return bcm_success(BCM_mldsa65_sign(
      out_encoded_signature,
      reinterpret_cast<const BCM_mldsa65_private_key *>(private_key), msg,
      msg_len, context, context_len));
}